

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuse.cpp
# Opt level: O2

Spectrum * __thiscall
phyr::DiffuseAreaLight::sample_li
          (Spectrum *__return_storage_ptr__,DiffuseAreaLight *this,Interaction *ref,Point2f *u,
          Vector3f *wi,double *pdf,VisibilityTester *vis)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  Interaction *pIVar5;
  Vector3<double> *pVVar6;
  double *pdVar7;
  byte bVar8;
  double dVar9;
  undefined1 local_178 [16];
  double local_168;
  Interaction pShape;
  Vector3<double> local_f8 [4];
  double local_98 [13];
  
  bVar8 = 0;
  (*((this->shape).super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Shape
    [9])(&pShape);
  if ((*pdf != 0.0) || (NAN(*pdf))) {
    local_168 = pShape.p.z - (ref->p).z;
    dVar1 = pShape.p.x - (ref->p).x;
    dVar2 = pShape.p.y - (ref->p).y;
    dVar9 = local_168 * local_168 + dVar1 * dVar1 + dVar2 * dVar2;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      local_178._8_4_ = SUB84(dVar2,0);
      local_178._0_8_ = dVar1;
      local_178._12_4_ = (int)((ulong)dVar2 >> 0x20);
      normalize<double>(local_f8,(Vector3<double> *)local_178);
      wi->z = local_f8[0].z;
      wi->x = local_f8[0].x;
      wi->y = local_f8[0].y;
      lVar4 = 0xc;
      pVVar6 = local_f8;
      for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
        pVVar6->x = (ref->p).x;
        ref = (Interaction *)((long)ref + (ulong)bVar8 * -0x10 + 8);
        pVVar6 = (Vector3<double> *)((long)pVVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      }
      pIVar5 = &pShape;
      pdVar7 = local_98;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar7 = (pIVar5->p).x;
        pIVar5 = (Interaction *)((long)pIVar5 + (ulong)bVar8 * -0x10 + 8);
        pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
      }
      memcpy(vis,local_f8,0xc0);
      local_f8[0].z = -wi->z;
      local_f8[0].x = -wi->x;
      local_f8[0].y = -wi->y;
      (*(this->super_AreaLight).super_Light._vptr_Light[9])
                (__return_storage_ptr__,this,&pShape,local_f8);
      return __return_storage_ptr__;
    }
  }
  *pdf = 0.0;
  CoefficientSpectrum<60>::CoefficientSpectrum
            (&__return_storage_ptr__->super_CoefficientSpectrum<60>,0.0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum DiffuseAreaLight::sample_li(const Interaction& ref, const Point2f& u,
                                     Vector3f* wi, Real* pdf,
                                     VisibilityTester* vis) const {
    Interaction pShape = shape->sample(ref, u, pdf);
    if (*pdf == 0 || (pShape.p - ref.p).lengthSquared() == 0) {
        *pdf = 0;
        return 0.f;
    }
    *wi = normalize(pShape.p - ref.p);
    *vis = VisibilityTester(ref, pShape);
    return l(pShape, -*wi);
}